

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

FileDescriptor * __thiscall
google::protobuf::DescriptorPool::NewPlaceholderFile(DescriptorPool *this,string *name)

{
  pthread_mutex_t *in_RAX;
  FileDescriptor *pFVar1;
  MutexLockMaybe lock;
  MutexLockMaybe local_18;
  
  local_18.mu_ = (Mutex *)in_RAX;
  internal::MutexLockMaybe::MutexLockMaybe(&local_18,this->mutex_);
  pFVar1 = NewPlaceholderFileWithMutexHeld(this,name);
  if ((pthread_mutex_t *)local_18.mu_ != (pthread_mutex_t *)0x0) {
    pthread_mutex_unlock((pthread_mutex_t *)local_18.mu_);
  }
  return pFVar1;
}

Assistant:

FileDescriptor* DescriptorPool::NewPlaceholderFile(
    const std::string& name) const {
  MutexLockMaybe lock(mutex_);
  return NewPlaceholderFileWithMutexHeld(name);
}